

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O0

void __thiscall Timidity::Renderer::recompute_freq(Renderer *this,int v)

{
  float fVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  double a;
  int pb;
  int sign;
  Channel *ch;
  int v_local;
  Renderer *this_local;
  
  bVar2 = this->voice[v].channel;
  iVar3 = this->voice[v].sample_increment;
  iVar5 = this->channel[bVar2].pitchbend;
  if ((this->voice[v].sample)->sample_rate != 0) {
    if (this->voice[v].vibrato_control_ratio != 0) {
      memset(this->voice[v].vibrato_sample_increment,0,0x80);
    }
    if (((iVar5 == 0x2000) || (iVar5 < 0)) || (0x3fff < iVar5)) {
      this->voice[v].frequency = this->voice[v].orig_frequency;
    }
    else {
      iVar5 = iVar5 + -0x2000;
      fVar1 = this->channel[bVar2].pitchfactor;
      if ((fVar1 == 0.0) && (!NAN(fVar1))) {
        iVar4 = iVar5;
        if (iVar5 < 1) {
          iVar4 = -iVar5;
        }
        dVar6 = std::pow(5.30498947741318e-315,
                         (double)(ulong)(uint)((float)(iVar4 * this->channel[bVar2].pitchsens) /
                                              9.8292e+06));
        this->channel[bVar2].pitchfactor = SUB84(dVar6,0);
      }
      if (iVar5 < 0) {
        this->voice[v].frequency = this->voice[v].orig_frequency / this->channel[bVar2].pitchfactor;
      }
      else {
        this->voice[v].frequency = this->voice[v].orig_frequency * this->channel[bVar2].pitchfactor;
      }
    }
    fVar1 = (((float)(this->voice[v].sample)->sample_rate * this->voice[v].frequency) /
            ((this->voice[v].sample)->root_freq * this->rate)) * 4096.0;
    if (iVar3 < 0) {
      fVar1 = -fVar1;
    }
    this->voice[v].sample_increment = (int)fVar1;
  }
  return;
}

Assistant:

void Renderer::recompute_freq(int v)
{
	Channel *ch = &channel[voice[v].channel];
	int 
		sign = (voice[v].sample_increment < 0), /* for bidirectional loops */
		pb = ch->pitchbend;
	double a;

	if (voice[v].sample->sample_rate == 0)
	{
		return;
	}

	if (voice[v].vibrato_control_ratio != 0)
	{
		/* This instrument has vibrato. Invalidate any precomputed
		   sample_increments. */
		memset(voice[v].vibrato_sample_increment, 0, sizeof(voice[v].vibrato_sample_increment));
	}

	if (pb == 0x2000 || pb < 0 || pb > 0x3FFF)
	{
		voice[v].frequency = voice[v].orig_frequency;
	}
	else
	{
		pb -= 0x2000;
		if (ch->pitchfactor == 0)
		{
			/* Damn. Somebody bent the pitch. */
			ch->pitchfactor = float(pow(2.f, ((abs(pb) * ch->pitchsens) / (8191.f * 1200.f))));
		}
		if (pb < 0)
		{
			voice[v].frequency = voice[v].orig_frequency / ch->pitchfactor;
		}
		else
		{
			voice[v].frequency = voice[v].orig_frequency * ch->pitchfactor;
		}
	}

	a = FSCALE(((double)(voice[v].sample->sample_rate) * voice[v].frequency) /
		((double)(voice[v].sample->root_freq) * rate),
		FRACTION_BITS);

	if (sign) 
		a = -a; /* need to preserve the loop direction */

	voice[v].sample_increment = (int)(a);
}